

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

pair<const_void_*,_const_pybind11::detail::type_info_*>
pybind11::detail::
type_caster_base<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_&>_>
::src_and_type(itype *src)

{
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar1;
  
  pVar1 = type_caster_generic::src_and_type
                    (src,(type_info *)
                         &iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>const&>
                          ::typeinfo,(type_info *)0x0);
  return pVar1;
}

Assistant:

static std::pair<const void *, const type_info *> src_and_type(const itype *src) {
        auto &cast_type = typeid(itype);
        const std::type_info *instance_type = nullptr;
        const void *vsrc = polymorphic_type_hook<itype>::get(src, instance_type);
        if (instance_type && !same_type(cast_type, *instance_type)) {
            // This is a base pointer to a derived type. If the derived type is registered
            // with pybind11, we want to make the full derived object available.
            // In the typical case where itype is polymorphic, we get the correct
            // derived pointer (which may be != base pointer) by a dynamic_cast to
            // most derived type. If itype is not polymorphic, we won't get here
            // except via a user-provided specialization of polymorphic_type_hook,
            // and the user has promised that no this-pointer adjustment is
            // required in that case, so it's OK to use static_cast.
            if (const auto *tpi = get_type_info(*instance_type))
                return {vsrc, tpi};
        }
        // Otherwise we have either a nullptr, an `itype` pointer, or an unknown derived pointer, so
        // don't do a cast
        return type_caster_generic::src_and_type(src, cast_type, instance_type);
    }